

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprLoadDoclists(Fts3Cursor *pCsr,int *pnPhrase,int *pnToken)

{
  int iVar1;
  Fts3Cursor *local_38;
  LoadDoclistCtx sCtx;
  int rc;
  int *pnToken_local;
  int *pnPhrase_local;
  Fts3Cursor *pCsr_local;
  
  memset(&local_38,0,0x10);
  local_38 = pCsr;
  iVar1 = fts3ExprIterate(pCsr->pExpr,fts3ExprLoadDoclistsCb,&local_38);
  if (pnPhrase != (int *)0x0) {
    *pnPhrase = (int)sCtx.pCsr;
  }
  if (pnToken != (int *)0x0) {
    *pnToken = sCtx.pCsr._4_4_;
  }
  return iVar1;
}

Assistant:

static int fts3ExprLoadDoclists(
  Fts3Cursor *pCsr,               /* Fts3 cursor for current query */
  int *pnPhrase,                  /* OUT: Number of phrases in query */
  int *pnToken                    /* OUT: Number of tokens in query */
){
  int rc;                         /* Return Code */
  LoadDoclistCtx sCtx = {0,0,0};  /* Context for fts3ExprIterate() */
  sCtx.pCsr = pCsr;
  rc = fts3ExprIterate(pCsr->pExpr, fts3ExprLoadDoclistsCb, (void *)&sCtx);
  if( pnPhrase ) *pnPhrase = sCtx.nPhrase;
  if( pnToken ) *pnToken = sCtx.nToken;
  return rc;
}